

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  Ch *pCVar4;
  Ch *pCVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar12;
  byte bVar13;
  uint16_t uVar14;
  ulong uVar15;
  byte *pbVar16;
  byte *pbVar17;
  ushort uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  double dVar24;
  Number NVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  pbVar3 = (byte *)is->src_;
  bVar2 = *pbVar3;
  pbVar17 = pbVar3;
  bVar13 = bVar2;
  if (bVar2 == 0x2d) {
    pbVar17 = pbVar3 + 1;
    bVar13 = pbVar3[1];
  }
  pCVar4 = is->head_;
  pCVar5 = is->dst_;
  if (bVar13 == 0x30) {
    uVar20 = (uint)pbVar17[1];
    pbVar16 = pbVar17 + 1;
    dVar24 = 0.0;
    bVar8 = false;
    uVar23 = 0;
    bVar7 = false;
    iVar9 = 0;
    bVar6 = false;
    uVar22 = 0;
    goto LAB_0010e7ee;
  }
  if ((byte)(bVar13 - 0x31) < 9) {
    uVar22 = bVar13 - 0x30;
    bVar13 = pbVar17[1];
    uVar15 = (ulong)bVar13;
    pbVar16 = pbVar17 + 1;
    dVar24 = 0.0;
    if (bVar2 == 0x2d) {
      if ((byte)(bVar13 - 0x30) < 10) {
        iVar9 = 0;
LAB_0010e65f:
        if (uVar22 < 0xccccccc) {
LAB_0010e668:
          uVar22 = (uVar22 * 10 + (int)uVar15) - 0x30;
          iVar9 = iVar9 + 1;
          bVar13 = pbVar16[1];
          uVar15 = (ulong)bVar13;
          pbVar16 = pbVar16 + 1;
          if (9 < (byte)(bVar13 - 0x30)) goto LAB_0010e73e;
          goto LAB_0010e65f;
        }
        if (uVar22 != 0xccccccc) goto LAB_0010e6e0;
        if ((byte)uVar15 < 0x39) goto LAB_0010e668;
        uVar22 = 0xccccccc;
        uVar15 = 0x39;
LAB_0010e6e0:
        uVar23 = (ulong)uVar22;
        if (bVar2 == 0x2d) {
          do {
            if ((0xccccccccccccccb < uVar23) && (0x38 < (byte)uVar15 || uVar23 != 0xccccccccccccccc)
               ) goto LAB_0010e78d;
            uVar23 = (uVar15 & 0xf) + uVar23 * 10;
            iVar9 = iVar9 + 1;
            bVar13 = pbVar16[1];
            uVar15 = (ulong)bVar13;
            pbVar16 = pbVar16 + 1;
          } while ((byte)(bVar13 - 0x30) < 10);
        }
        else {
          do {
            if ((0x1999999999999998 < uVar23) &&
               (0x35 < (byte)uVar15 || uVar23 != 0x1999999999999999)) goto LAB_0010e78d;
            uVar23 = (uVar15 & 0xf) + uVar23 * 10;
            iVar9 = iVar9 + 1;
            bVar13 = pbVar16[1];
            uVar15 = (ulong)bVar13;
            pbVar16 = pbVar16 + 1;
          } while ((byte)(bVar13 - 0x30) < 10);
        }
        uVar20 = (uint)bVar13;
        dVar24 = 0.0;
        bVar6 = true;
        bVar8 = false;
        bVar7 = false;
        goto LAB_0010e7ee;
      }
LAB_0010ecdc:
      iVar9 = 0;
    }
    else {
      if (9 < (byte)(bVar13 - 0x30)) goto LAB_0010ecdc;
      iVar9 = 0;
      do {
        if (0x19999998 < uVar22) {
          if (uVar22 != 0x19999999) goto LAB_0010e6e0;
          if (0x35 < (byte)uVar15) {
            uVar22 = 0x19999999;
            goto LAB_0010e6e0;
          }
        }
        uVar22 = (uVar22 * 10 + (int)uVar15) - 0x30;
        iVar9 = iVar9 + 1;
        bVar13 = pbVar16[1];
        uVar15 = (ulong)bVar13;
        pbVar16 = pbVar16 + 1;
      } while ((byte)(bVar13 - 0x30) < 10);
    }
LAB_0010e73e:
    uVar20 = (uint)bVar13;
    bVar8 = false;
    uVar23 = 0;
    bVar7 = false;
    bVar6 = false;
    goto LAB_0010e7ee;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                  ,0x5fc,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  lVar11 = (long)pbVar17 - (long)pCVar4;
  *(undefined4 *)(this + 0x30) = 3;
  goto LAB_0010ea53;
LAB_0010ea1a:
  do {
    pbVar17 = pbVar16 + 1;
    pbVar16 = pbVar16 + 1;
  } while ((byte)(*pbVar17 - 0x30) < 10);
LAB_0010eac7:
  iVar9 = -iVar21;
  if (!bVar8) {
    iVar9 = iVar21;
  }
LAB_0010ead4:
  if (bVar7) {
LAB_0010ead9:
    uVar20 = iVar9 + iVar19;
    if ((int)uVar20 < -0x134) {
      NVar25.i64 = 0;
      if (0xfffffd97 < uVar20) {
        NVar25.d = (dVar24 / 1e+308) /
                   *(double *)(internal::Pow10(int)::e + (ulong)(-uVar20 - 0x134) * 8);
        goto LAB_0010ec58;
      }
    }
    else {
      if ((int)uVar20 < 0) {
        NVar25.d = dVar24 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar20 * 8);
      }
      else {
        if (0x134 < uVar20) {
          __assert_fail("n >= 0 && n <= 308",
                        "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/internal/pow10.h"
                        ,0x30,"double rapidjson::internal::Pow10(int)");
        }
        NVar25.d = dVar24 * *(double *)(internal::Pow10(int)::e + (ulong)uVar20 * 8);
      }
LAB_0010ec58:
      if (1.79769313486232e+308 < NVar25.d) {
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                        ,0x6ab,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        *(undefined4 *)(this + 0x30) = 0xd;
        goto LAB_0010ec7c;
      }
    }
    pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
              Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                        (&handler->stack_,1);
    if (bVar2 == 0x2d) {
      NVar25.u64 = NVar25.u64 ^ 0x8000000000000000;
    }
    (pGVar12->data_).s.str = (Ch *)0x216000000000000;
    (pGVar12->data_).n = NVar25;
    pbVar17 = pbVar16;
  }
  else {
    pbVar17 = pbVar16;
    if (!bVar6) {
      if (bVar2 == 0x2d) {
        pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
                  Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                            (&handler->stack_,1);
        (pGVar12->data_).s.str = (Ch *)0x0;
        *(long *)&pGVar12->data_ = (long)(int)-uVar22;
        uVar14 = 0xb6;
        if ((int)uVar22 < 1) {
          uVar14 = 0x1f6;
        }
        (pGVar12->data_).f.flags = uVar14;
      }
      else {
        pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
                  Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                            (&handler->stack_,1);
        (pGVar12->data_).s.str = (Ch *)0x0;
        *(ulong *)&pGVar12->data_ = uVar15;
        (pGVar12->data_).f.flags = (ushort)(-1 < (int)uVar22) << 5 | 0x1d6;
      }
      goto LAB_0010ecbd;
    }
    if (bVar2 != 0x2d) {
      pGVar12 = internal::Stack<rapidjson::CrtAllocator>::
                Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
      (pGVar12->data_).s.str = (Ch *)0x0;
      *(ulong *)&pGVar12->data_ = uVar23;
      uVar18 = (ushort)((uVar23 & 0xffffffff80000000) == 0) << 5 | 0x1d6;
      if (uVar23 >> 0x20 != 0) {
        uVar18 = (ushort)(-1 < (long)uVar23) << 7 | 0x116;
      }
      (pGVar12->data_).f.flags = uVar18;
      goto LAB_0010ecbd;
    }
    bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::Int64(handler,-uVar23);
    if (bVar8) goto LAB_0010ecbd;
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                    ,0x6c3,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    *(undefined4 *)(this + 0x30) = 0x10;
LAB_0010ec7c:
    *(long *)(this + 0x38) = (long)pbVar3 - (long)pCVar4;
    pbVar17 = pbVar16;
  }
  goto LAB_0010ecbd;
LAB_0010e78d:
  auVar26._8_4_ = (int)(uVar23 >> 0x20);
  auVar26._0_8_ = uVar23;
  auVar26._12_4_ = 0x45300000;
  dVar24 = (auVar26._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar23) - 4503599627370496.0);
  do {
    dVar24 = dVar24 * 10.0 + (double)((int)uVar15 + -0x30);
    bVar13 = pbVar16[1];
    uVar15 = (ulong)bVar13;
    uVar20 = (uint)bVar13;
    pbVar16 = pbVar16 + 1;
  } while ((byte)(bVar13 - 0x30) < 10);
  bVar8 = true;
  bVar7 = true;
  bVar6 = true;
LAB_0010e7ee:
  uVar15 = (ulong)uVar22;
  if ((char)uVar20 == '.') {
    uVar20 = (uint)pbVar16[1];
    pbVar17 = pbVar16 + 1;
    if ((byte)(pbVar16[1] - 0x3a) < 0xf6) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                      ,0x627,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xe;
      *(long *)(this + 0x38) = (long)pbVar17 - (long)pCVar4;
      goto LAB_0010ecbd;
    }
    iVar19 = 0;
    if (bVar8) {
LAB_0010e8a5:
      do {
        pbVar16 = pbVar17;
        if (0x39 < (byte)uVar20) goto LAB_0010e94e;
        if (iVar9 < 0x11) {
          dVar24 = dVar24 * 10.0 + (double)(int)(uVar20 - 0x30);
          iVar19 = iVar19 + -1;
          if (0.0 < dVar24) {
            iVar9 = iVar9 + 1;
          }
        }
        pbVar1 = pbVar17 + 1;
        uVar20 = (uint)*pbVar1;
        pbVar16 = pbVar17 + 1;
        pbVar17 = pbVar16;
      } while ('/' < (char)*pbVar1);
      iVar9 = 0;
      goto LAB_0010ead4;
    }
    if (!bVar6) {
      uVar23 = uVar15;
    }
    iVar19 = 0;
    do {
      if ((0x39 < (byte)uVar20) || (uVar23 >> 0x35 != 0)) {
        auVar27._8_4_ = (int)(uVar23 >> 0x20);
        auVar27._0_8_ = uVar23;
        auVar27._12_4_ = 0x45300000;
        dVar24 = (auVar27._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar23) - 4503599627370496.0);
        bVar7 = true;
        goto LAB_0010e8a5;
      }
      pbVar16 = pbVar17 + 1;
      iVar19 = iVar19 + -1;
      uVar23 = (ulong)(uVar20 - 0x30) + uVar23 * 10;
      iVar9 = iVar9 + (uint)(uVar23 != 0);
      pbVar1 = pbVar17 + 1;
      uVar20 = (uint)*pbVar1;
      pbVar17 = pbVar16;
    } while ('/' < (char)*pbVar1);
    dVar24 = (double)(long)uVar23;
    iVar9 = 0;
    goto LAB_0010ead9;
  }
  iVar19 = 0;
LAB_0010e94e:
  iVar9 = 0;
  if ((uVar20 | 0x20) != 0x65) goto LAB_0010ead4;
  uVar10 = uVar15;
  if (bVar6) {
    uVar10 = uVar23;
  }
  if (!bVar7) {
    auVar28._8_4_ = (int)(uVar10 >> 0x20);
    auVar28._0_8_ = uVar10;
    auVar28._12_4_ = 0x45300000;
    dVar24 = (auVar28._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
    bVar7 = true;
  }
  bVar13 = pbVar16[1];
  bVar8 = bVar13 != 0x2b;
  if ((bVar8) && (bVar13 != 0x2d)) {
    if ((byte)(bVar13 - 0x30) < 10) {
      pbVar16 = pbVar16 + 2;
      iVar21 = bVar13 - 0x30;
LAB_0010ea7b:
      do {
        bVar13 = *pbVar16;
        if (9 < (byte)(bVar13 - 0x30)) {
          bVar8 = false;
          goto LAB_0010eac7;
        }
        pbVar16 = pbVar16 + 1;
        iVar21 = iVar21 * 10 + (uint)bVar13 + -0x30;
      } while (iVar21 <= 0x134 - iVar19);
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                      ,0x677,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xd;
      *(long *)(this + 0x38) = (long)pbVar3 - (long)pCVar4;
      pbVar17 = pbVar16;
      goto LAB_0010ecbd;
    }
    pbVar17 = pbVar16 + 1;
  }
  else {
    pbVar17 = pbVar16 + 2;
    if ((byte)(*pbVar17 - 0x30) < 10) {
      pbVar16 = pbVar16 + 3;
      iVar21 = *pbVar17 - 0x30;
      if (bVar13 != 0x2b) {
        if (0 < iVar19) {
          __assert_fail("expFrac <= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                        ,0x667,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        bVar13 = *pbVar16;
        if ((byte)(bVar13 - 0x30) < 10) {
          do {
            iVar21 = iVar21 * 10 + (uint)bVar13 + -0x30;
            if ((iVar19 + 0x7ffffff7) / 10 < iVar21) goto LAB_0010ea1a;
            pbVar16 = pbVar16 + 1;
            bVar13 = *pbVar16;
          } while ((byte)(bVar13 - 0x30) < 10);
        }
        else {
          bVar8 = true;
        }
        goto LAB_0010eac7;
      }
      goto LAB_0010ea7b;
    }
    pbVar17 = pbVar16 + 2;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                  ,0x67c,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  lVar11 = (long)pbVar17 - (long)pCVar4;
  *(undefined4 *)(this + 0x30) = 0xf;
LAB_0010ea53:
  *(long *)(this + 0x38) = lVar11;
LAB_0010ecbd:
  is->src_ = (Ch *)pbVar17;
  is->dst_ = pCVar5;
  is->head_ = pCVar4;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            if (Consume(s, 'N')) {
                if (Consume(s, 'a') && Consume(s, 'N')) {
                    d = std::numeric_limits<double>::quiet_NaN();
                    useNanOrInf = true;
                }
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I'))) {
                if (Consume(s, 'n') && Consume(s, 'f')) {
                    d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                    useNanOrInf = true;

                    if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                                && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y')))) {
                        RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
                    }
                }
            }
            
            if (RAPIDJSON_UNLIKELY(!useNanOrInf)) {
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    // (exp + expFrac) must not underflow int => we're detecting when -exp gets
                    // dangerously close to INT_MIN (a pessimistic next digit 9 would push it into
                    // underflow territory):
                    //
                    //        -(exp * 10 + 9) + expFrac >= INT_MIN
                    //   <=>  exp <= (expFrac - INT_MIN - 9) / 10
                    RAPIDJSON_ASSERT(expFrac <= 0);
                    int maxExp = (expFrac + 2147483639) / 10;

                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp)) {
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                StringStream srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               // Use > max, instead of == inf, to fix bogus warning -Wfloat-equal
               if (d > std::numeric_limits<double>::max()) {
                   // Overflow
                   // TODO: internal::StrtodX should report overflow (or underflow)
                   RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
               }

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }